

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

char * mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::GetTypeName
                 (void)

{
  int iVar1;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::GetTypeName()::
      nm_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>
                                 ::GetTypeName()::nm_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Conditional< ",&local_49);
      std::operator+(&local_28,&local_48,
                     "N2mp19AlgebraicConstraintINS_15QuadAndLinTermsENS_9AlgConRhsILin1EEEEE");
      std::operator+(&CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::
                      GetTypeName()::nm_abi_cxx11_,&local_28," >");
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::
                    GetTypeName()::nm_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>
                           ::GetTypeName()::nm_abi_cxx11_);
    }
  }
  return CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::GetTypeName()::
         nm_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

static const char* GetTypeName() {
    static std::string nm =
      std::string("Conditional< ") +
      typeid(Con).name() + " >";
    return nm.c_str();
  }